

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void musig_tweak_test_helper
               (secp256k1_xonly_pubkey *agg_pk,uchar *sk0,uchar *sk1,
               secp256k1_musig_keyagg_cache *keyagg_cache)

{
  uint uVar1;
  int iVar2;
  secp256k1_pubkey *pubkey;
  uchar *b32;
  secp256k1_musig_session *secnonce_00;
  secp256k1_musig_session *session_00;
  secp256k1_musig_session *partial_sig_00;
  secp256k1_context *secnonce_01;
  long lVar3;
  secp256k1_musig_pubnonce *psVar4;
  secp256k1_musig_partial_sig *psVar5;
  secp256k1_context *keypair_00;
  secp256k1_musig_partial_sig *partial_sig_ptr [2];
  secp256k1_musig_pubnonce *pubnonce_ptr [2];
  uchar msg [32];
  secp256k1_pubkey pk [2];
  secp256k1_musig_partial_sig partial_sig [2];
  uchar session_secrand [2] [32];
  secp256k1_musig_session session;
  uchar final_sig [64];
  secp256k1_keypair keypair [2];
  secp256k1_musig_secnonce secnonce [2];
  secp256k1_musig_aggnonce aggnonce;
  secp256k1_musig_pubnonce pubnonce [2];
  secp256k1_scalar sStackY_690;
  secp256k1_scalar sStackY_670;
  secp256k1_ge sStackY_648;
  secp256k1_musig_session *psStackY_5f0;
  secp256k1_musig_keyagg_cache *psStackY_5e8;
  secp256k1_context *psStackY_5e0;
  secp256k1_musig_partial_sig *local_5a8 [2];
  secp256k1_musig_pubnonce *local_598 [2];
  uchar local_588 [32];
  secp256k1_pubkey local_568;
  secp256k1_pubkey local_528;
  undefined1 local_4e8 [80];
  uchar local_498 [32];
  uchar local_478 [43];
  secp256k1_musig_session local_44d;
  undefined1 local_3c8 [64];
  undefined1 local_388 [192];
  undefined1 local_2c8 [268];
  undefined1 local_1bc [264];
  secp256k1_musig_pubnonce sStack_b4;
  
  b32 = local_498;
  psVar5 = (secp256k1_musig_partial_sig *)local_4e8;
  psVar4 = (secp256k1_musig_pubnonce *)local_1bc;
  lVar3 = 0;
  do {
    psVar4 = psVar4 + 1;
    local_598[lVar3] = psVar4;
    local_5a8[lVar3] = psVar5;
    psStackY_5e0 = (secp256k1_context *)0x17c3df;
    testrand256(b32);
    lVar3 = lVar3 + 1;
    b32 = b32 + 0x20;
    psVar5 = psVar5 + 1;
  } while (lVar3 == 1);
  session_00 = (secp256k1_musig_session *)local_2c8;
  psStackY_5e0 = (secp256k1_context *)0x17c411;
  uVar1 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session_00,sk0);
  keypair_00 = (secp256k1_context *)(ulong)uVar1;
  local_568.data[0] = local_2c8[0x20];
  local_568.data[1] = local_2c8[0x21];
  local_568.data[2] = local_2c8[0x22];
  local_568.data[3] = local_2c8[0x23];
  local_568.data[4] = local_2c8[0x24];
  local_568.data[5] = local_2c8[0x25];
  local_568.data[6] = local_2c8[0x26];
  local_568.data[7] = local_2c8[0x27];
  local_568.data[8] = local_2c8[0x28];
  local_568.data[9] = local_2c8[0x29];
  local_568.data[10] = local_2c8[0x2a];
  local_568.data[0xb] = local_2c8[0x2b];
  local_568.data[0xc] = local_2c8[0x2c];
  local_568.data[0xd] = local_2c8[0x2d];
  local_568.data[0xe] = local_2c8[0x2e];
  local_568.data[0xf] = local_2c8[0x2f];
  local_568.data[0x10] = local_2c8[0x30];
  local_568.data[0x11] = local_2c8[0x31];
  local_568.data[0x12] = local_2c8[0x32];
  local_568.data[0x13] = local_2c8[0x33];
  local_568.data[0x14] = local_2c8[0x34];
  local_568.data[0x15] = local_2c8[0x35];
  local_568.data[0x16] = local_2c8[0x36];
  local_568.data[0x17] = local_2c8[0x37];
  local_568.data[0x18] = local_2c8[0x38];
  local_568.data[0x19] = local_2c8[0x39];
  local_568.data[0x1a] = local_2c8[0x3a];
  local_568.data[0x1b] = local_2c8[0x3b];
  local_568.data[0x1c] = local_2c8[0x3c];
  local_568.data[0x1d] = local_2c8[0x3d];
  local_568.data[0x1e] = local_2c8[0x3e];
  local_568.data[0x1f] = local_2c8[0x3f];
  local_568.data[0x20] = local_2c8[0x40];
  local_568.data[0x21] = local_2c8[0x41];
  local_568.data[0x22] = local_2c8[0x42];
  local_568.data[0x23] = local_2c8[0x43];
  local_568.data[0x24] = local_2c8[0x44];
  local_568.data[0x25] = local_2c8[0x45];
  local_568.data[0x26] = local_2c8[0x46];
  local_568.data[0x27] = local_2c8[0x47];
  local_568.data[0x28] = local_2c8[0x48];
  local_568.data[0x29] = local_2c8[0x49];
  local_568.data[0x2a] = local_2c8[0x4a];
  local_568.data[0x2b] = local_2c8[0x4b];
  local_568.data[0x2c] = local_2c8[0x4c];
  local_568.data[0x2d] = local_2c8[0x4d];
  local_568.data[0x2e] = local_2c8[0x4e];
  local_568.data[0x2f] = local_2c8[0x4f];
  local_568.data[0x30] = local_2c8[0x50];
  local_568.data[0x31] = local_2c8[0x51];
  local_568.data[0x32] = local_2c8[0x52];
  local_568.data[0x33] = local_2c8[0x53];
  local_568.data[0x34] = local_2c8[0x54];
  local_568.data[0x35] = local_2c8[0x55];
  local_568.data[0x36] = local_2c8[0x56];
  local_568.data[0x37] = local_2c8[0x57];
  local_568.data[0x38] = local_2c8[0x58];
  local_568.data[0x39] = local_2c8[0x59];
  local_568.data[0x3a] = local_2c8[0x5a];
  local_568.data[0x3b] = local_2c8[0x5b];
  local_568.data[0x3c] = local_2c8[0x5c];
  local_568.data[0x3d] = local_2c8[0x5d];
  local_568.data[0x3e] = local_2c8[0x5e];
  local_568.data[0x3f] = local_2c8[0x5f];
  secnonce_01 = (secp256k1_context *)local_388;
  psStackY_5e0 = (secp256k1_context *)0x17c456;
  memcpy(secnonce_01,session_00,0x60);
  if (uVar1 == 0) {
    psStackY_5e0 = (secp256k1_context *)0x17c6f4;
    musig_tweak_test_helper_cold_12();
LAB_0017c6f4:
    psStackY_5e0 = (secp256k1_context *)0x17c6f9;
    musig_tweak_test_helper_cold_11();
LAB_0017c6f9:
    secnonce_00 = (secp256k1_musig_session *)local_2c8;
    psStackY_5e0 = (secp256k1_context *)0x17c6fe;
    musig_tweak_test_helper_cold_1();
LAB_0017c6fe:
    psStackY_5e0 = (secp256k1_context *)0x17c703;
    musig_tweak_test_helper_cold_2();
LAB_0017c703:
    psStackY_5e0 = (secp256k1_context *)0x17c708;
    musig_tweak_test_helper_cold_10();
LAB_0017c708:
    psStackY_5e0 = (secp256k1_context *)0x17c70d;
    musig_tweak_test_helper_cold_9();
LAB_0017c70d:
    psStackY_5e0 = (secp256k1_context *)0x17c712;
    musig_tweak_test_helper_cold_8();
LAB_0017c712:
    psStackY_5e0 = (secp256k1_context *)0x17c717;
    musig_tweak_test_helper_cold_7();
LAB_0017c717:
    partial_sig_00 = session_00;
    psStackY_5e0 = (secp256k1_context *)0x17c71c;
    musig_tweak_test_helper_cold_3();
LAB_0017c71c:
    psStackY_5e0 = (secp256k1_context *)0x17c721;
    musig_tweak_test_helper_cold_4();
  }
  else {
    keypair_00 = (secp256k1_context *)(local_388 + 0x60);
    session_00 = (secp256k1_musig_session *)local_2c8;
    psStackY_5e0 = (secp256k1_context *)0x17c486;
    iVar2 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)session_00,sk1);
    local_528.data[0] = local_2c8[0x20];
    local_528.data[1] = local_2c8[0x21];
    local_528.data[2] = local_2c8[0x22];
    local_528.data[3] = local_2c8[0x23];
    local_528.data[4] = local_2c8[0x24];
    local_528.data[5] = local_2c8[0x25];
    local_528.data[6] = local_2c8[0x26];
    local_528.data[7] = local_2c8[0x27];
    local_528.data[8] = local_2c8[0x28];
    local_528.data[9] = local_2c8[0x29];
    local_528.data[10] = local_2c8[0x2a];
    local_528.data[0xb] = local_2c8[0x2b];
    local_528.data[0xc] = local_2c8[0x2c];
    local_528.data[0xd] = local_2c8[0x2d];
    local_528.data[0xe] = local_2c8[0x2e];
    local_528.data[0xf] = local_2c8[0x2f];
    local_528.data[0x10] = local_2c8[0x30];
    local_528.data[0x11] = local_2c8[0x31];
    local_528.data[0x12] = local_2c8[0x32];
    local_528.data[0x13] = local_2c8[0x33];
    local_528.data[0x14] = local_2c8[0x34];
    local_528.data[0x15] = local_2c8[0x35];
    local_528.data[0x16] = local_2c8[0x36];
    local_528.data[0x17] = local_2c8[0x37];
    local_528.data[0x18] = local_2c8[0x38];
    local_528.data[0x19] = local_2c8[0x39];
    local_528.data[0x1a] = local_2c8[0x3a];
    local_528.data[0x1b] = local_2c8[0x3b];
    local_528.data[0x1c] = local_2c8[0x3c];
    local_528.data[0x1d] = local_2c8[0x3d];
    local_528.data[0x1e] = local_2c8[0x3e];
    local_528.data[0x1f] = local_2c8[0x3f];
    local_528.data[0x20] = local_2c8[0x40];
    local_528.data[0x21] = local_2c8[0x41];
    local_528.data[0x22] = local_2c8[0x42];
    local_528.data[0x23] = local_2c8[0x43];
    local_528.data[0x24] = local_2c8[0x44];
    local_528.data[0x25] = local_2c8[0x45];
    local_528.data[0x26] = local_2c8[0x46];
    local_528.data[0x27] = local_2c8[0x47];
    local_528.data[0x28] = local_2c8[0x48];
    local_528.data[0x29] = local_2c8[0x49];
    local_528.data[0x2a] = local_2c8[0x4a];
    local_528.data[0x2b] = local_2c8[0x4b];
    local_528.data[0x2c] = local_2c8[0x4c];
    local_528.data[0x2d] = local_2c8[0x4d];
    local_528.data[0x2e] = local_2c8[0x4e];
    local_528.data[0x2f] = local_2c8[0x4f];
    local_528.data[0x30] = local_2c8[0x50];
    local_528.data[0x31] = local_2c8[0x51];
    local_528.data[0x32] = local_2c8[0x52];
    local_528.data[0x33] = local_2c8[0x53];
    local_528.data[0x34] = local_2c8[0x54];
    local_528.data[0x35] = local_2c8[0x55];
    local_528.data[0x36] = local_2c8[0x56];
    local_528.data[0x37] = local_2c8[0x57];
    local_528.data[0x38] = local_2c8[0x58];
    local_528.data[0x39] = local_2c8[0x59];
    local_528.data[0x3a] = local_2c8[0x5a];
    local_528.data[0x3b] = local_2c8[0x5b];
    local_528.data[0x3c] = local_2c8[0x5c];
    local_528.data[0x3d] = local_2c8[0x5d];
    local_528.data[0x3e] = local_2c8[0x5e];
    local_528.data[0x3f] = local_2c8[0x5f];
    psStackY_5e0 = (secp256k1_context *)0x17c4c9;
    secnonce_01 = keypair_00;
    memcpy(keypair_00,session_00,0x60);
    if (iVar2 == 0) goto LAB_0017c6f4;
    psStackY_5e0 = (secp256k1_context *)0x17c4dc;
    testrand256(local_588);
    session_00 = (secp256k1_musig_session *)local_2c8;
    psStackY_5e0 = (secp256k1_context *)0x17c51e;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)session_00,
                       (secp256k1_musig_pubnonce *)(local_1bc + 0x84),local_498,sk0,&local_568,
                       (uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar2 != 1) goto LAB_0017c6f9;
    secnonce_00 = (secp256k1_musig_session *)(local_2c8 + 0x84);
    psStackY_5e0 = (secp256k1_context *)0x17c56a;
    session_00 = secnonce_00;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_nonce_gen
                      (CTX,(secp256k1_musig_secnonce *)secnonce_00,&sStack_b4,local_478,sk1,
                       &local_528,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar2 != 1) goto LAB_0017c6fe;
    session_00 = (secp256k1_musig_session *)local_1bc;
    psStackY_5e0 = (secp256k1_context *)0x17c591;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_nonce_agg(CTX,(secp256k1_musig_aggnonce *)session_00,local_598,2);
    if (iVar2 == 0) goto LAB_0017c703;
    session_00 = &local_44d;
    psStackY_5e0 = (secp256k1_context *)0x17c5bd;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_nonce_process
                      (CTX,session_00,(secp256k1_musig_aggnonce *)local_1bc,local_588,keyagg_cache);
    if (iVar2 == 0) goto LAB_0017c708;
    session_00 = (secp256k1_musig_session *)local_4e8;
    psStackY_5e0 = (secp256k1_context *)0x17c5f4;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)session_00,
                       (secp256k1_musig_secnonce *)local_2c8,(secp256k1_keypair *)local_388,
                       keyagg_cache,&local_44d);
    if (iVar2 == 0) goto LAB_0017c70d;
    partial_sig_00 = (secp256k1_musig_session *)(local_4e8 + 0x24);
    psStackY_5e0 = (secp256k1_context *)0x17c624;
    session_00 = partial_sig_00;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_partial_sign
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig_00,
                       (secp256k1_musig_secnonce *)secnonce_00,(secp256k1_keypair *)keypair_00,
                       keyagg_cache,&local_44d);
    if (iVar2 == 0) goto LAB_0017c712;
    session_00 = (secp256k1_musig_session *)local_4e8;
    psStackY_5e0 = (secp256k1_context *)0x17c658;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)session_00,
                       (secp256k1_musig_pubnonce *)(local_1bc + 0x84),&local_568,keyagg_cache,
                       &local_44d);
    if (iVar2 != 1) goto LAB_0017c717;
    psStackY_5e0 = (secp256k1_context *)0x17c681;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_partial_sig_verify
                      (CTX,(secp256k1_musig_partial_sig *)partial_sig_00,&sStack_b4,&local_528,
                       keyagg_cache,&local_44d);
    if (iVar2 != 1) goto LAB_0017c71c;
    partial_sig_00 = (secp256k1_musig_session *)local_3c8;
    psStackY_5e0 = (secp256k1_context *)0x17c6b1;
    secnonce_01 = CTX;
    iVar2 = secp256k1_musig_partial_sig_agg(CTX,(uchar *)partial_sig_00,&local_44d,local_5a8,2);
    if (iVar2 == 1) {
      partial_sig_00 = (secp256k1_musig_session *)local_3c8;
      psStackY_5e0 = (secp256k1_context *)0x17c6d9;
      secnonce_01 = CTX;
      iVar2 = secp256k1_schnorrsig_verify(CTX,(uchar *)partial_sig_00,local_588,0x20,agg_pk);
      if (iVar2 != 0) {
        return;
      }
      goto LAB_0017c726;
    }
  }
  psStackY_5e0 = (secp256k1_context *)0x17c726;
  musig_tweak_test_helper_cold_5();
LAB_0017c726:
  psStackY_5e0 = (secp256k1_context *)musig_test_set_secnonce;
  musig_tweak_test_helper_cold_6();
  psStackY_5f0 = secnonce_00;
  psStackY_5e8 = keyagg_cache;
  psStackY_5e0 = keypair_00;
  secp256k1_scalar_set_b32(&sStackY_690,partial_sig_00->data,(int *)0x0);
  secp256k1_scalar_set_b32(&sStackY_670,partial_sig_00->data + 0x20,(int *)0x0);
  iVar2 = secp256k1_pubkey_load(CTX,&sStackY_648,pubkey);
  if (iVar2 != 0) {
    secp256k1_musig_secnonce_save((secp256k1_musig_secnonce *)secnonce_01,&sStackY_690,&sStackY_648)
    ;
    return;
  }
  musig_test_set_secnonce_cold_1();
  return;
}

Assistant:

static void musig_tweak_test_helper(const secp256k1_xonly_pubkey* agg_pk, const unsigned char *sk0, const unsigned char *sk1, secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_pubkey pk[2];
    unsigned char session_secrand[2][32];
    unsigned char msg[32];
    secp256k1_musig_secnonce secnonce[2];
    secp256k1_musig_pubnonce pubnonce[2];
    const secp256k1_musig_pubnonce *pubnonce_ptr[2];
    secp256k1_musig_aggnonce aggnonce;
    secp256k1_keypair keypair[2];
    secp256k1_musig_session session;
    secp256k1_musig_partial_sig partial_sig[2];
    const secp256k1_musig_partial_sig *partial_sig_ptr[2];
    unsigned char final_sig[64];
    int i;

    for (i = 0; i < 2; i++) {
        pubnonce_ptr[i] = &pubnonce[i];
        partial_sig_ptr[i] = &partial_sig[i];

        testrand256(session_secrand[i]);
    }
    CHECK(create_keypair_and_pk(&keypair[0], &pk[0], sk0) == 1);
    CHECK(create_keypair_and_pk(&keypair[1], &pk[1], sk1) == 1);
    testrand256(msg);

    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[0], &pubnonce[0], session_secrand[0], sk0, &pk[0], NULL, NULL, NULL) == 1);
    CHECK(secp256k1_musig_nonce_gen(CTX, &secnonce[1], &pubnonce[1], session_secrand[1], sk1, &pk[1], NULL, NULL, NULL) == 1);

    CHECK(secp256k1_musig_nonce_agg(CTX, &aggnonce, pubnonce_ptr, 2) == 1);
    CHECK(secp256k1_musig_nonce_process(CTX, &session, &aggnonce, msg, keyagg_cache) == 1);

    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[0], &secnonce[0], &keypair[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sign(CTX, &partial_sig[1], &secnonce[1], &keypair[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[0], &pubnonce[0], &pk[0], keyagg_cache, &session) == 1);
    CHECK(secp256k1_musig_partial_sig_verify(CTX, &partial_sig[1], &pubnonce[1], &pk[1], keyagg_cache, &session) == 1);

    CHECK(secp256k1_musig_partial_sig_agg(CTX, final_sig, &session, partial_sig_ptr, 2) == 1);
    CHECK(secp256k1_schnorrsig_verify(CTX, final_sig, msg, sizeof(msg), agg_pk) == 1);
}